

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
winmd::reader::table_base::set_columns
          (table_base *this,uint8_t a,uint8_t b,uint8_t c,uint8_t d,uint8_t e,uint8_t f)

{
  reference pvVar1;
  value_type local_21;
  value_type local_1f;
  value_type local_1d;
  value_type local_1b;
  value_type local_19;
  value_type local_17;
  uint8_t e_local;
  uint8_t d_local;
  uint8_t c_local;
  uint8_t b_local;
  uint8_t a_local;
  table_base *this_local;
  
  this->m_row_size = a + b + c + d + e + f;
  local_17 = (value_type)((ushort)a << 8);
  pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                     (&this->m_columns,0);
  *pvVar1 = local_17;
  if (b != '\0') {
    local_19.size = b;
    local_19.offset = a;
    pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                       (&this->m_columns,1);
    *pvVar1 = local_19;
  }
  if (c != '\0') {
    local_1b.size = c;
    local_1b.offset = a + b;
    pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                       (&this->m_columns,2);
    *pvVar1 = local_1b;
  }
  if (d != '\0') {
    local_1d.size = d;
    local_1d.offset = a + b + c;
    pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                       (&this->m_columns,3);
    *pvVar1 = local_1d;
  }
  if (e != '\0') {
    local_1f.size = e;
    local_1f.offset = a + b + c + d;
    pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                       (&this->m_columns,4);
    *pvVar1 = local_1f;
  }
  if (f != '\0') {
    local_21.size = f;
    local_21.offset = a + b + c + d + e;
    pvVar1 = cppwinrt::std::array<winmd::reader::table_base::column,_6UL>::operator[]
                       (&this->m_columns,5);
    *pvVar1 = local_21;
  }
  return;
}

Assistant:

void set_columns(uint8_t const a, uint8_t const b = 0, uint8_t const c = 0, uint8_t const d = 0, uint8_t const e = 0, uint8_t const f = 0) noexcept
        {
            XLANG_ASSERT(a);
            XLANG_ASSERT(a <= 8);
            XLANG_ASSERT(b <= 8);
            XLANG_ASSERT(c <= 8);
            XLANG_ASSERT(d <= 8);
            XLANG_ASSERT(e <= 8);
            XLANG_ASSERT(f <= 8);

            XLANG_ASSERT(!m_row_size);
            m_row_size = a + b + c + d + e + f;
            XLANG_ASSERT(m_row_size < UINT8_MAX);

            m_columns[0] = { 0, a };
            if (b) { m_columns[1] = { static_cast<uint8_t>(a), b }; }
            if (c) { m_columns[2] = { static_cast<uint8_t>(a + b), c }; }
            if (d) { m_columns[3] = { static_cast<uint8_t>(a + b + c), d }; }
            if (e) { m_columns[4] = { static_cast<uint8_t>(a + b + c + d), e }; }
            if (f) { m_columns[5] = { static_cast<uint8_t>(a + b + c + d + e), f }; }
        }